

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcProcess::~IfcProcess(IfcProcess *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this->super_IfcObject = 0x901178;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0x9011f0;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0x9011a0;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x9011c8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
             field_0x10;
  if (puVar1 != &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
                 .field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this->super_IfcObject = 0x901290;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0x9012b8;
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x60;
  if (puVar1 != &(this->super_IfcObject).field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x38;
  if (puVar1 != &(this->super_IfcObject).field_0x48) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x10;
  if (puVar1 != &(this->super_IfcObject).field_0x20) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcProcess() : Object("IfcProcess") {}